

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VLDR_VSTR_sp(DisasContext_conflict1 *s,arg_VLDR_VSTR_sp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  TCGv_i32 a32;
  TCGv_i32 var;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  uint32_t offset;
  TCGContext_conflict1 *tcg_ctx;
  arg_VLDR_VSTR_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpsp_v2(s->isar);
  if (_Var1) {
    _Var1 = vfp_access_check(s);
    if (_Var1) {
      addr._4_4_ = a->imm * 4;
      if (a->u == 0) {
        addr._4_4_ = a->imm * -4;
      }
      a32 = add_reg_for_lit(s,a->rn,addr._4_4_);
      var = tcg_temp_new_i32(tcg_ctx_00);
      if (a->l == 0) {
        neon_load_reg32(tcg_ctx_00,var,a->vd);
        iVar2 = get_mem_index(s);
        gen_aa32_st32(s,var,a32,iVar2);
      }
      else {
        iVar2 = get_mem_index(s);
        gen_aa32_ld32u(s,var,a32,iVar2);
        neon_store_reg32(tcg_ctx_00,var,a->vd);
      }
      tcg_temp_free_i32(tcg_ctx_00,var);
      tcg_temp_free_i32(tcg_ctx_00,a32);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VLDR_VSTR_sp(DisasContext *s, arg_VLDR_VSTR_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t offset;
    TCGv_i32 addr, tmp;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    offset = a->imm << 2;
    if (!a->u) {
#ifdef _MSC_VER
        offset = 0 - offset;
#else
        offset = -offset;
#endif
    }

    /* For thumb, use of PC is UNPREDICTABLE.  */
    addr = add_reg_for_lit(s, a->rn, offset);
    tmp = tcg_temp_new_i32(tcg_ctx);
    if (a->l) {
        gen_aa32_ld32u(s, tmp, addr, get_mem_index(s));
        neon_store_reg32(tcg_ctx, tmp, a->vd);
    } else {
        neon_load_reg32(tcg_ctx, tmp, a->vd);
        gen_aa32_st32(s, tmp, addr, get_mem_index(s));
    }
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i32(tcg_ctx, addr);

    return true;
}